

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall duckdb::RowGroup::MergeIntoStatistics(RowGroup *this,TableStatistics *other)

{
  ColumnStatistics *this_00;
  BaseStatistics *other_00;
  TableStatistics *lock;
  idx_t i;
  TableStatistics *i_00;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  stats_lock;
  
  lock = other;
  TableStatistics::GetLock((TableStatistics *)&stack0xffffffffffffffd8);
  for (i_00 = (TableStatistics *)0x0;
      i_00 < (TableStatistics *)
             ((long)(this->columns).
                    super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    .
                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->columns).
                    super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    .
                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
      i_00 = (TableStatistics *)
             ((long)&(i_00->stats_lock).internal.
                     super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)) {
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                 *)&stack0xffffffffffffffd8);
    this_00 = TableStatistics::GetStats(other,(TableStatisticsLock *)lock,(idx_t)i_00);
    other_00 = ColumnStatistics::Statistics(this_00);
    lock = i_00;
    MergeIntoStatistics(this,(idx_t)i_00,other_00);
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void RowGroup::MergeIntoStatistics(TableStatistics &other) {
	auto stats_lock = other.GetLock();
	for (idx_t i = 0; i < columns.size(); i++) {
		MergeIntoStatistics(i, other.GetStats(*stats_lock, i).Statistics());
	}
}